

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O0

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance>::
createInstance(TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance>
               *this,Context *context)

{
  Texture2DArrayShadowTestInstance *this_00;
  Context *context_local;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance> *this_local
  ;
  
  this_00 = (Texture2DArrayShadowTestInstance *)operator_new(0x288);
  texture::anon_unknown_0::Texture2DArrayShadowTestInstance::Texture2DArrayShadowTestInstance
            (this_00,context,&this->m_testsParameters);
  return &this_00->super_TestInstance;
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}